

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

int __thiscall clunk::HashEntry::Score(HashEntry *this,int ply)

{
  int iVar1;
  uint uVar2;
  char *__assertion;
  
  if ((uint)ply < 100) {
    iVar1 = (int)this->score;
    if (iVar1 < 0x7919) {
      if (-0x7919 < this->score) {
        return iVar1;
      }
      uVar2 = iVar1 + ply;
      if ((int)uVar2 < -31000) {
        if (0xffff8300 < uVar2) {
          return uVar2;
        }
        __assertion = "(score + ply) > -Infinity";
        uVar2 = 0x4e;
      }
      else {
        __assertion = "(score + ply) < -MateScore";
        uVar2 = 0x4d;
      }
    }
    else {
      uVar2 = iVar1 - ply;
      if ((int)uVar2 < 0x7919) {
        __assertion = "(score - ply) > MateScore";
        uVar2 = 0x48;
      }
      else {
        if (uVar2 < 32000) {
          return uVar2;
        }
        __assertion = "(score - ply) < Infinity";
        uVar2 = 0x49;
      }
    }
  }
  else {
    __assertion = "(ply >= 0) & (ply < MaxPlies)";
    uVar2 = 0x46;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                ,uVar2,"int clunk::HashEntry::Score(const int) const");
}

Assistant:

int Score(const int ply) const {
    // get mate-in-N scores relative to root
    assert((ply >= 0) & (ply < MaxPlies));
    if (score > MateScore) {
      assert((score - ply) > MateScore);
      assert((score - ply) < Infinity);
      return (score - ply);
    }
    if (score < -MateScore) {
      assert((score + ply) < -MateScore);
      assert((score + ply) > -Infinity);
      return (score + ply);
    }
    assert(abs(score) < Infinity);
    return score;
  }